

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_verify(secp256k1_context *ctx,uchar *seckey)

{
  uint uVar1;
  undefined4 in_ECX;
  int iVar2;
  undefined1 auVar3 [16];
  int overflow;
  secp256k1_scalar sec;
  int local_2c;
  secp256k1_scalar local_28;
  
  secp256k1_scalar_set_b32(&local_28,seckey,&local_2c);
  uVar1 = 0;
  if (local_2c == 0) {
    auVar3._0_4_ = -(uint)((int)local_28.d[2] == 0 && (int)local_28.d[0] == 0);
    auVar3._4_4_ = -(uint)(local_28.d[2]._4_4_ == 0 && local_28.d[0]._4_4_ == 0);
    auVar3._8_4_ = -(uint)((int)local_28.d[3] == 0 && (int)local_28.d[1] == 0);
    auVar3._12_4_ = -(uint)(local_28.d[3]._4_4_ == 0 && local_28.d[1]._4_4_ == 0);
    iVar2 = movmskps(in_ECX,auVar3);
    uVar1 = (uint)(iVar2 != 0xf);
  }
  return uVar1;
}

Assistant:

int secp256k1_ec_seckey_verify(const secp256k1_context* ctx, const unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret;
    int overflow;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    secp256k1_scalar_set_b32(&sec, seckey, &overflow);
    ret = !overflow && !secp256k1_scalar_is_zero(&sec);
    secp256k1_scalar_clear(&sec);
    return ret;
}